

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfmcs.cc
# Opt level: O0

InputGraph
anon_unknown.dwarf_246e6a::read_vfmcs
          (ifstream *infile,string *filename,bool vertex_labels,bool directed)

{
  string_view l_00;
  string_view label;
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte in_CL;
  string *in_RDX;
  long *in_RSI;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> in_RDI;
  byte in_R8B;
  uint e;
  int c;
  int c_end;
  int r_1;
  uint l;
  int r;
  int k2;
  int k1;
  int p;
  int m;
  int size;
  InputGraph *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdb8;
  allocator<char> *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  uint in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdd8;
  undefined1 uVar6;
  string *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  string *filename_00;
  undefined4 in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf4;
  int local_f8;
  string local_f1;
  uint local_cc;
  int local_c8;
  undefined1 local_c2;
  __sv_type local_80;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 local_56;
  undefined1 local_55;
  uint local_20;
  byte local_1a;
  byte local_19;
  string *local_18;
  long *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = read_word((ifstream *)in_stack_fffffffffffffd90);
  uVar4 = std::ios::operator!((void *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  if ((uVar4 & 1) != 0) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    uVar6 = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    GraphFileError::GraphFileError
              ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(bool)uVar6);
    local_55 = 0;
    __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_56 = 0;
  InputGraph::InputGraph
            ((InputGraph *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20)
             ,SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x18,0),
             SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x10,0));
  iVar2 = InputGraph::size((InputGraph *)0x1fa998);
  local_5c = (iVar2 * 0x21) / 100;
  local_64 = 0;
  local_68 = 0;
  for (local_60 = 1; local_60 < local_5c && local_64 < 0x10; local_60 = local_60 << 1) {
    local_64 = local_68;
    local_68 = local_68 + 1;
  }
  for (local_6c = 0; iVar2 = local_6c, iVar3 = InputGraph::size((InputGraph *)0x1faa83),
      iVar2 < iVar3; local_6c = local_6c + 1) {
    local_70 = read_word((ifstream *)in_stack_fffffffffffffd90);
    local_70 = local_70 >> (0x10U - (char)local_64 & 0x1f);
    if ((local_19 & 1) != 0) {
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd90)
      ;
      l_00._M_len._7_1_ = in_stack_fffffffffffffdaf;
      l_00._M_len._0_7_ = in_stack_fffffffffffffda8;
      l_00._M_str._0_4_ = in_stack_fffffffffffffdb0;
      l_00._M_str._4_4_ = in_stack_fffffffffffffdb4;
      InputGraph::set_vertex_label
                ((InputGraph *)in_stack_fffffffffffffda0,
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),l_00);
      std::__cxx11::string::~string(in_stack_fffffffffffffd90);
    }
  }
  bVar1 = std::ios::operator!((void *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_c2 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    uVar6 = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    GraphFileError::GraphFileError
              ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(bool)uVar6);
    local_c2 = 0;
    __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_c8 = 0;
  while( true ) {
    iVar2 = local_c8;
    iVar3 = InputGraph::size((InputGraph *)0x1face6);
    if (iVar3 <= iVar2) {
      std::istream::peek();
      uVar6 = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) {
        return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
               (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
               in_RDI._M_t.
               super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
               super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
               super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
      }
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 in_stack_fffffffffffffdc0);
      GraphFileError::GraphFileError
                ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(bool)uVar6);
      __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    in_stack_fffffffffffffdf4 = read_word((ifstream *)in_stack_fffffffffffffd90);
    local_cc = in_stack_fffffffffffffdf4;
    bVar1 = std::ios::operator!((void *)((long)local_10 + *(long *)(*local_10 + -0x18)));
    in_stack_fffffffffffffdf0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf0);
    if ((bVar1 & 1) != 0) break;
    for (local_f8 = 0; local_f8 < (int)local_cc; local_f8 = local_f8 + 1) {
      in_stack_fffffffffffffdcc = read_word((ifstream *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdcc;
      in_stack_fffffffffffffdd0 = InputGraph::size((InputGraph *)0x1fae8a);
      if (in_stack_fffffffffffffdd0 <= in_stack_fffffffffffffdcc) {
        uVar5 = __cxa_allocate_exception(0x30);
        uVar6 = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
        std::__cxx11::to_string((uint)((ulong)uVar5 >> 0x20));
        std::operator+((char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        GraphFileError::GraphFileError
                  ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(bool)uVar6);
        __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      if ((local_1a & 1) == 0) {
        InputGraph::add_edge
                  ((InputGraph *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
        label._M_str._0_4_ = in_stack_fffffffffffffdf0;
        label._M_len = (size_t)in_stack_fffffffffffffde8;
        label._M_str._4_4_ = in_stack_fffffffffffffdf4;
        InputGraph::add_directed_edge
                  ((InputGraph *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)in_stack_fffffffffffffdd8,
                   label);
      }
      read_word((ifstream *)in_stack_fffffffffffffd90);
    }
    local_c8 = local_c8 + 1;
  }
  uVar5 = __cxa_allocate_exception(0x30);
  filename_00 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  GraphFileError::GraphFileError
            ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             filename_00,local_18,SUB81((ulong)uVar5 >> 0x38,0));
  __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_vfmcs(ifstream && infile, const string & filename, bool vertex_labels, bool directed) -> InputGraph
    {
        int size = read_word(infile);
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        InputGraph result{size, vertex_labels, false};

        // to be like the CP 2011 labelling scheme...
        int m = result.size() * 33 / 100;
        int p = 1, k1 = 0, k2 = 0;
        while (p < m && k1 < 16) {
            p *= 2;
            k1 = k2;
            k2++;
        }

        for (int r = 0; r < result.size(); ++r) {
            unsigned l = read_word(infile) >> (16 - k1);
            if (vertex_labels)
                result.set_vertex_label(r, to_string(l));
        }

        if (! infile)
            throw GraphFileError{filename, "error reading attributes", true};

        for (int r = 0; r < result.size(); ++r) {
            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                unsigned e = read_word(infile);

                if (e >= unsigned(result.size()))
                    throw GraphFileError{filename, "edge index " + to_string(e) + " out of bounds", true};

                if (directed)
                    result.add_directed_edge(r, e, "directed");
                else
                    result.add_edge(r, e);
                read_word(infile);
            }
        }

        infile.peek();
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }